

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderTextureSizeTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::ShaderTextureSizeTests::init
          (ShaderTextureSizeTests *this,EVP_PKEY_CTX *ctx)

{
  TextureType TVar1;
  Context *pCVar2;
  uint uVar3;
  undefined8 *puVar4;
  long *plVar5;
  TestNode *node;
  ulong *puVar6;
  long *plVar7;
  ulong uVar8;
  long lVar9;
  string desc;
  string name;
  long *local_2b0;
  long local_2a8;
  long local_2a0;
  long lStack_298;
  ulong *local_290;
  long local_288;
  ulong local_280;
  undefined8 uStack_278;
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  int local_24c;
  ulong *local_248;
  long local_240;
  ulong local_238;
  long lStack_230;
  undefined1 *local_228;
  long local_220;
  undefined1 local_218;
  undefined7 uStack_217;
  uint local_204;
  TestNode *local_200;
  SamplerType *local_1f8;
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0 [2];
  long *local_1d0;
  long local_1c8;
  long local_1c0;
  long lStack_1b8;
  long local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1b0 = 0;
  local_200 = (TestNode *)this;
  do {
    local_1f8 = init::samplerTypes + local_1b0;
    local_204 = 0x215a401;
    lVar9 = 0;
    do {
      local_240 = 0;
      local_238 = local_238 & 0xffffffffffffff00;
      local_248 = &local_238;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_248);
      puVar6 = puVar4 + 2;
      if ((ulong *)*puVar4 == puVar6) {
        local_280 = *puVar6;
        uStack_278 = puVar4[3];
        local_290 = &local_280;
      }
      else {
        local_280 = *puVar6;
        local_290 = (ulong *)*puVar4;
      }
      local_288 = puVar4[1];
      *puVar4 = puVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      local_24c = init::sampleCounts[lVar9];
      std::ostream::operator<<(local_1a8,local_24c);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar8 = 0xf;
      if (local_290 != &local_280) {
        uVar8 = local_280;
      }
      if (uVar8 < (ulong)(local_220 + local_288)) {
        uVar8 = 0xf;
        if (local_228 != &local_218) {
          uVar8 = CONCAT71(uStack_217,local_218);
        }
        if (uVar8 < (ulong)(local_220 + local_288)) goto LAB_014b447b;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,(ulong)local_290);
      }
      else {
LAB_014b447b:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_228);
      }
      local_2b0 = &local_2a0;
      plVar5 = puVar4 + 2;
      if ((long *)*puVar4 == plVar5) {
        local_2a0 = *plVar5;
        lStack_298 = puVar4[3];
      }
      else {
        local_2a0 = *plVar5;
        local_2b0 = (long *)*puVar4;
      }
      local_2a8 = puVar4[1];
      *puVar4 = plVar5;
      puVar4[1] = 0;
      *(undefined1 *)plVar5 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b0);
      local_270 = &local_260;
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_260 = *plVar7;
        lStack_258 = plVar5[3];
      }
      else {
        local_260 = *plVar7;
        local_270 = (long *)*plVar5;
      }
      local_268 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_270);
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_1c0 = *plVar7;
        lStack_1b8 = plVar5[3];
        local_1d0 = &local_1c0;
      }
      else {
        local_1c0 = *plVar7;
        local_1d0 = (long *)*plVar5;
      }
      local_1c8 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_270 != &local_260) {
        operator_delete(local_270,local_260 + 1);
      }
      if (local_2b0 != &local_2a0) {
        operator_delete(local_2b0,local_2a0 + 1);
      }
      if (local_228 != &local_218) {
        operator_delete(local_228,CONCAT71(uStack_217,local_218) + 1);
      }
      if (local_290 != &local_280) {
        operator_delete(local_290,local_280 + 1);
      }
      if (local_248 != &local_238) {
        operator_delete(local_248,local_238 + 1);
      }
      local_220 = 0;
      local_218 = 0;
      local_228 = &local_218;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_228);
      puVar6 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar6) {
        local_238 = *puVar6;
        lStack_230 = plVar5[3];
        local_248 = &local_238;
      }
      else {
        local_238 = *puVar6;
        local_248 = (ulong *)*plVar5;
      }
      local_240 = plVar5[1];
      *plVar5 = (long)puVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,local_24c);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar8 = 0xf;
      if (local_248 != &local_238) {
        uVar8 = local_238;
      }
      if (uVar8 < (ulong)(local_1e8 + local_240)) {
        uVar8 = 0xf;
        if (local_1f0 != local_1e0) {
          uVar8 = local_1e0[0];
        }
        if (uVar8 < (ulong)(local_1e8 + local_240)) goto LAB_014b4731;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_248);
      }
      else {
LAB_014b4731:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_1f0);
      }
      puVar6 = puVar4 + 2;
      if ((ulong *)*puVar4 == puVar6) {
        local_280 = *puVar6;
        uStack_278 = puVar4[3];
        local_290 = &local_280;
      }
      else {
        local_280 = *puVar6;
        local_290 = (ulong *)*puVar4;
      }
      local_288 = puVar4[1];
      *puVar4 = puVar6;
      puVar4[1] = 0;
      *(undefined1 *)puVar6 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_290);
      local_2b0 = &local_2a0;
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_2a0 = *plVar7;
        lStack_298 = plVar5[3];
      }
      else {
        local_2a0 = *plVar7;
        local_2b0 = (long *)*plVar5;
      }
      local_2a8 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b0);
      local_270 = &local_260;
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_260 = *plVar7;
        lStack_258 = plVar5[3];
      }
      else {
        local_260 = *plVar7;
        local_270 = (long *)*plVar5;
      }
      local_268 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_2b0 != &local_2a0) {
        operator_delete(local_2b0,local_2a0 + 1);
      }
      if (local_290 != &local_280) {
        operator_delete(local_290,local_280 + 1);
      }
      if (local_1f0 != local_1e0) {
        operator_delete(local_1f0,local_1e0[0] + 1);
      }
      if (local_248 != &local_238) {
        operator_delete(local_248,local_238 + 1);
      }
      if (local_228 != &local_218) {
        operator_delete(local_228,CONCAT71(uStack_217,local_218) + 1);
      }
      node = (TestNode *)operator_new(0xb8);
      pCVar2 = (Context *)local_200[1]._vptr_TestNode;
      TVar1 = local_1f8->type;
      tcu::TestCase::TestCase
                ((TestCase *)node,pCVar2->m_testCtx,(char *)local_1d0,(char *)local_270);
      node[1]._vptr_TestNode = (_func_int **)pCVar2;
      node->_vptr_TestNode = (_func_int **)&PTR__TextureSizeCase_0215a4e8;
      *(TextureType *)&node[1].m_testCtx = TVar1;
      *(int *)((long)&node[1].m_testCtx + 4) = local_24c;
      *(bool *)&node[1].m_name._M_dataplus._M_p =
           (TVar1 | TEXTURE_INT_2D) == TEXTURE_INT_2D_ARRAY || TVar1 == TEXTURE_UINT_2D_ARRAY;
      *(undefined8 *)((long)&node[1].m_name._M_dataplus._M_p + 4) = 0;
      node[1].m_name.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&node[1].m_name.field_2 + 8) = 0;
      node[1].m_description._M_dataplus._M_p = (pointer)0x0;
      node[1].m_description._M_string_length = 0;
      *(undefined4 *)&node[1].m_description.field_2 = 0;
      *(undefined2 *)((long)&node[1].m_description.field_2 + 4) = 0x101;
      tcu::TestNode::addChild(local_200,node);
      if (local_270 != &local_260) {
        operator_delete(local_270,local_260 + 1);
      }
      if (local_1d0 != &local_1c0) {
        operator_delete(local_1d0,local_1c0 + 1);
      }
      lVar9 = 1;
      uVar3 = local_204 & 1;
      local_204 = 0;
    } while (uVar3 != 0);
    local_1b0 = local_1b0 + 1;
    if (local_1b0 == 6) {
      return 6;
    }
  } while( true );
}

Assistant:

void ShaderTextureSizeTests::init (void)
{
	static const struct SamplerType
	{
		TextureSizeCase::TextureType	type;
		const char*						name;
	} samplerTypes[] =
	{
		{ TextureSizeCase::TEXTURE_FLOAT_2D,		"texture_2d"			},
		{ TextureSizeCase::TEXTURE_FLOAT_2D_ARRAY,	"texture_2d_array"		},
		{ TextureSizeCase::TEXTURE_INT_2D,			"texture_int_2d"		},
		{ TextureSizeCase::TEXTURE_INT_2D_ARRAY,	"texture_int_2d_array"	},
		{ TextureSizeCase::TEXTURE_UINT_2D,			"texture_uint_2d"		},
		{ TextureSizeCase::TEXTURE_UINT_2D_ARRAY,	"texture_uint_2d_array"	},
	};

	static const int sampleCounts[] = { 1, 4 };

	for (int samplerTypeNdx = 0; samplerTypeNdx < DE_LENGTH_OF_ARRAY(samplerTypes); ++samplerTypeNdx)
	{
		for (int sampleCountNdx = 0; sampleCountNdx < DE_LENGTH_OF_ARRAY(sampleCounts); ++sampleCountNdx)
		{
			const std::string name = std::string() + "samples_" + de::toString(sampleCounts[sampleCountNdx]) + "_" + samplerTypes[samplerTypeNdx].name;
			const std::string desc = std::string() + "samples count = " + de::toString(sampleCounts[sampleCountNdx]) + ", type = " + samplerTypes[samplerTypeNdx].name;

			addChild(new TextureSizeCase(m_context, name.c_str(), desc.c_str(), samplerTypes[samplerTypeNdx].type, sampleCounts[sampleCountNdx]));
		}
	}
}